

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O0

void genfluxterm(Reaction *r,int type,int n)

{
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  Item *q;
  Rterm *rt;
  Symbol *s;
  Symbol *sym;
  Item *item;
  
  sym = *(Symbol **)(in_RDI + 0x28);
  item = *(Item **)(in_RDI + 8);
  if (*(short *)((long)&item->prev + 4) == 0) {
    diag((char *)item,(char *)sym);
  }
  sprintf(buf,"D%s",((item->element).sym)->name);
  lookup((char *)sym);
  if (((item->element).sym)->varnum < ncons) {
    diag((char *)item,(char *)sym);
  }
  insertstr(item,(char *)sym);
  if (in_ESI == 0) {
    insertsym(item,sym);
    if (item->next != (Item *)0x0) {
      sprintf(buf,"[%s]",item->next);
      insertstr(item,(char *)sym);
    }
  }
  else {
    sprintf(buf,"_RHS%d(",(ulong)in_EDX);
    insertstr(item,(char *)sym);
    if (item->next == (Item *)0x0) {
      sprintf(buf,"%d)",(ulong)(uint)((item->element).sym)->varnum);
    }
    else {
      sprintf(buf,"%d + %s)",(ulong)(uint)((item->element).sym)->varnum,item->next);
    }
    insertstr(item,(char *)sym);
  }
  if (*(long *)(in_RDI + 0x18) == 0) {
    insertstr(item,(char *)sym);
    insertstr(item,(char *)sym);
  }
  else {
    sprintf(buf," -= (f_flux = (%s) * ",*(undefined8 *)(in_RDI + 0x18));
    insertstr(item,(char *)sym);
    insertsym(item,sym);
    if (item->next != (Item *)0x0) {
      sprintf(buf,"[%s]",item->next);
      insertstr(item,(char *)sym);
    }
  }
  insertstr(item,(char *)sym);
  if ((in_ESI != 0) && (*(long *)(in_RDI + 0x18) != 0)) {
    sprintf(buf," _MATELM%d(",(ulong)in_EDX);
    insertstr(item,(char *)sym);
    if (item->next == (Item *)0x0) {
      sprintf(buf,"%d, %d)",(ulong)(uint)((item->element).sym)->varnum,
              (ulong)(uint)((item->element).sym)->varnum);
    }
    else {
      sprintf(buf,"%d + %s, %d + %s",(ulong)(uint)((item->element).sym)->varnum,item->next,
              (ulong)(uint)((item->element).sym)->varnum,item->next);
    }
    insertstr(item,(char *)sym);
    sprintf(buf,"+= %s;\n",*(undefined8 *)(in_RDI + 0x18));
    insertstr(item,(char *)sym);
  }
  return;
}

Assistant:

void genfluxterm(r, type, n)
	Reaction *r;
	int type;
	int n;
{
	Symbol *s;
	Rterm *rt;
	Item *q;

	q = r->position;
	rt = r->rterm[0];
	if (!(rt->isstate)) {
		diag(rt->sym->name, " must be (solved) STATE in flux reaction");
	}
	Sprintf(buf, "D%s", rt->sym->name);
	s = lookup(buf);
	if (rt->sym->varnum < ncons)
		diag(rt->sym->name, " is conserved and has a flux");
	/* the right hand side */
	Insertstr(q, "f_flux = b_flux = 0.;\n");
	if (type) {
		Sprintf(buf, "_RHS%d(", n);
		Insertstr(q, buf);
		if (rt->str) {
			Sprintf(buf, "%d + %s)", rt->sym->varnum, rt->str);
		} else {
			Sprintf(buf, "%d)", rt->sym->varnum);
		}
		Insertstr(q, buf);
	}else{
		Insertsym(q, s);/*needs processing in cout*/
		if (rt->str) {
			Sprintf(buf, "[%s]", rt->str);
			Insertstr(q, buf);
		}
	}
	if (r->krate[0]) {
		Sprintf(buf, " -= (f_flux = (%s) * ", r->krate[0]);
		Insertstr(q, buf);
		Insertsym(q, rt->sym);
		if (rt->str) {
			Sprintf(buf, "[%s]", rt->str);
			Insertstr(q, buf);
		}
	}else{
		Insertstr(q, "+= (b_flux = ");
		Insertstr(q, r->krate[1]);
	}
	Insertstr(q, ");\n");

	/* the matrix coefficient */
	if (type && r->krate[0]) {
		Sprintf(buf, " _MATELM%d(", n);
		Insertstr(q, buf);
		if (rt->str) {
			Sprintf(buf, "%d + %s, %d + %s", rt->sym->varnum, rt->str,
				rt->sym->varnum, rt->str);
		}else{
			Sprintf(buf, "%d, %d)",
				rt->sym->varnum, rt->sym->varnum);
		}
		Insertstr(q, buf);
		Sprintf(buf, "+= %s;\n", r->krate[0]);
		Insertstr(q, buf);
	}
}